

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  char *__assertion;
  
  uVar1 = l->tt_ & 0xf;
  if (uVar1 == 4) {
    if ((r->tt_ & 0xf) == 4) {
      if ((((TString *)(l->value_).gc)->tt & 0xf) == 4) {
        if ((((TString *)(r->value_).gc)->tt & 0xf) == 4) {
          uVar3 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
          return uVar3 >> 0x1f;
        }
        __assertion = "(((((r)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        __assertion = "(((((l)->value_).gc)->tt) & 0x0F) == 4";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2b6,"int luaV_lessthan(lua_State *, const TValue *, const TValue *)");
    }
  }
  else if ((uVar1 == 3) && ((r->tt_ & 0xf) == 3)) {
    iVar2 = LTnum(l,r);
    return iVar2;
  }
  iVar2 = luaT_callorderTM(L,l,r,TM_LT);
  if (-1 < iVar2) {
    return iVar2;
  }
  luaG_ordererror(L,l,r);
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LTnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) < 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LT)) < 0)  /* no metamethod? */
    luaG_ordererror(L, l, r);  /* error */
  return res;
}